

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O0

bool __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::DoPrepareNextMultiobjSolve
          (MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  Env *pEVar4;
  pair<bool,_mp::sol::Status> pVar5;
  TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
  *pTVar6;
  FlatModelInfo *pFVar7;
  TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
  *this_00;
  CStringRef in_RDX;
  BasicSolver *in_RSI;
  undefined4 *in_RDI;
  pair<bool,_mp::sol::Status> proc_sol;
  MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000f20;
  function<mp::Solution_()> *in_stack_fffffffffffffef8;
  function<mp::Solution_()> *in_stack_ffffffffffffff00;
  BasicFlatModelAPI *be;
  BasicSolver *in_stack_ffffffffffffff18;
  CStringRef in_stack_ffffffffffffff20;
  Env *in_stack_ffffffffffffff28;
  FlatModelInfo *in_stack_ffffffffffffff30;
  BasicCStringRef<char> local_a0 [3];
  function<mp::Solution_()> *in_stack_ffffffffffffff78;
  function<mp::sol::Status_()> *in_stack_ffffffffffffff80;
  MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffffc0;
  Status stt;
  BasicCStringRef<char> local_30;
  BasicCStringRef<char> local_28 [4];
  bool local_1;
  
  stt = (Status)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  iVar1 = in_RDI[0x14];
  in_RDI[0x14] = iVar1 + 1;
  sVar3 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::size
                    ((vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_> *)
                     (in_RDI + 2));
  if ((ulong)(long)(iVar1 + 1) < sVar3) {
    pEVar4 = EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x32));
    bVar2 = BasicSolver::verbose_mode(pEVar4);
    if (bVar2) {
      in_stack_ffffffffffffff28 = EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x32));
      fmt::BasicCStringRef<char>::BasicCStringRef
                (&local_30,
                 "\n\nMULTI-OBJECTIVE MODE: objective {} (out of {}) ...\n==============================================================================\n\n"
                );
      sVar3 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::size
                        ((vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_> *)
                         (in_RDI + 2));
      stt = (Status)(sVar3 >> 0x20);
      BasicSolver::Print<int,unsigned_long>
                (in_RSI,in_RDX,(int *)in_stack_ffffffffffffff30,
                 (unsigned_long *)in_stack_ffffffffffffff28);
    }
    if (in_RDI[0x14] != 0) {
      std::function<mp::sol::Status_()>::function
                ((function<mp::sol::Status_()> *)in_stack_ffffffffffffff00,
                 (function<mp::sol::Status_()> *)in_stack_fffffffffffffef8);
      std::function<mp::Solution_()>::function(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      pVar5 = ProcessMOIterationPostsolvedSolution
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff78);
      std::function<mp::Solution_()>::~function((function<mp::Solution_()> *)0x671214);
      std::function<mp::sol::Status_()>::~function((function<mp::sol::Status_()> *)0x671221);
      if (((ulong)pVar5 & 1) == 0) {
        pEVar4 = EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x32));
        bVar2 = BasicSolver::verbose_mode(pEVar4);
        if (bVar2) {
          EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x32));
          fmt::BasicCStringRef<char>::BasicCStringRef
                    (local_a0,
                     "   ... ABORTING: previous iteration\'s solve result: {} (code {}.)\n==============================================================================\n\n"
                    );
          sol::GetStatusName(stt);
          BasicSolver::Print<char_const*,mp::sol::Status>
                    (in_RSI,in_RDX,(char **)in_stack_ffffffffffffff30,
                     (Status *)in_stack_ffffffffffffff28);
        }
        return false;
      }
      RestrictLastObjVal(in_stack_00000f20);
    }
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::GetModelAPI((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                   *)(in_RDI + -0x6a));
    FlatModel<mp::DefaultFlatModelParams>::GetModelInfoWrt
              ((FlatModel<mp::DefaultFlatModelParams> *)0x671352);
    ConstraintManager::FillConstraintCounters
              ((ConstraintManager *)in_RDX.data_,(BasicFlatModelAPI *)in_RSI,
               in_stack_ffffffffffffff30);
    pTVar6 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::GetModelAPI((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)(in_RDI + -0x6a));
    pFVar7 = FlatModel<mp::DefaultFlatModelParams>::GetModelInfo
                       ((FlatModel<mp::DefaultFlatModelParams> *)0x67138b);
    BasicFlatModelAPI::InitProblemModificationPhase(&pTVar6->super_BasicFlatModelAPI,pFVar7);
    ReplaceCurrentObj((MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       *)pTVar6);
    be = (BasicFlatModelAPI *)(in_RDI + -0x68);
    this_00 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::GetModelAPI((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                             *)(in_RDI + -0x6a));
    FlatModel<mp::DefaultFlatModelParams>::GetVarNamer
              ((FlatModel<mp::DefaultFlatModelParams> *)(in_RDI + -0x6a));
    ConstraintManager::AddUnbridgedConstraintsToBackend
              ((ConstraintManager *)this_00,be,(ItemNamer *)pTVar6);
    pTVar6 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::GetModelAPI((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)(in_RDI + -0x6a));
    BasicFlatModelAPI::FinishProblemModificationPhase(&pTVar6->super_BasicFlatModelAPI);
    local_1 = true;
  }
  else {
    *in_RDI = 3;
    pEVar4 = EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x32));
    bVar2 = BasicSolver::verbose_mode(pEVar4);
    if (bVar2) {
      EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x32));
      fmt::BasicCStringRef<char>::BasicCStringRef
                (local_28,
                 "\n\n==============================================================================\nMULTI-OBJECTIVE MODE: done.\n\n"
                );
      BasicSolver::Print<>(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DoPrepareNextMultiobjSolve(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    if (++i_current_obj_ >= obj_new_.size()) {
      status_ = MOManagerStatus::FINISHED;
			if (MPD( GetEnv() ).verbose_mode())
				MPD( GetEnv() ).Print(
							"\n\n"
							"==============================================================================\n"
							"MULTI-OBJECTIVE MODE: done.\n\n");
			return false;                              // all done
    }
    if (MPD( GetEnv() ).verbose_mode())
      MPD( GetEnv() ).Print(
          "\n\n"
          "MULTI-OBJECTIVE MODE: objective {} (out of {}) ...\n"
          "==============================================================================\n\n"
          , i_current_obj_+1, obj_new_.size());
    if (i_current_obj_) {
      auto proc_sol = ProcessMOIterationPostsolvedSolution(get_stt, get_sol);
      if (!proc_sol.first) {
        if (MPD( GetEnv() ).verbose_mode())
          MPD( GetEnv() ).Print(
              "   ... ABORTING: previous iteration's solve result: {} (code {}.)\n"
              "==============================================================================\n\n"
              , sol::GetStatusName(proc_sol.second), proc_sol.second);
        return false;
      }
      RestrictLastObjVal();
    }
    MPD( FillConstraintCounters( MPD( GetModelAPI() ), *MPD( GetModelInfoWrt() ) ) );   // @todo a hack.
    MPD( GetModelAPI() ).InitProblemModificationPhase(   // For adding the new constraint. @todo a hack.
        MPD( GetModelInfo() ));                          // Ideally Model would notice changes and notify
    ReplaceCurrentObj();                  // After allowing model modification (needed by SCIP.)
    MPD( AddUnbridgedConstraintsToBackend(
        MPD( GetModelAPI() ), MPD( GetVarNamer() )) );
    MPD( GetModelAPI() ).FinishProblemModificationPhase();            // ModelAPI automatically.
    return true;
  }